

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-bench.cpp
# Opt level: O0

void print_usage(int param_1,char **argv)

{
  undefined8 uVar1;
  ulong uVar2;
  char *pcVar3;
  undefined8 *in_RSI;
  undefined8 in_stack_fffffffffffff928;
  output_formats format;
  char *local_6d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff940;
  allocator<char> *in_stack_fffffffffffff960;
  allocator<char> *paVar4;
  allocator<char> *in_stack_fffffffffffff968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff970;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_pair<int,_int>_ptr
  *in_stack_fffffffffffff980;
  vector<ggml_type,_std::allocator<ggml_type>_> *in_stack_fffffffffffff988;
  vector<llama_split_mode,_std::allocator<llama_split_mode>_> *values;
  allocator<char> local_619;
  string local_618 [32];
  string local_5f8 [39];
  allocator<char> local_5d1;
  string local_5d0 [32];
  string local_5b0 [39];
  allocator<char> local_589;
  string local_588 [32];
  string local_568 [39];
  allocator<char> local_541;
  string local_540 [16];
  string *in_stack_fffffffffffffad0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffad8;
  string *in_stack_fffffffffffffae0;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffae8;
  allocator<char> local_4f9;
  string local_4f8 [32];
  string local_4d8 [39];
  allocator<char> local_4b1;
  string local_4b0 [56];
  string local_478 [39];
  allocator<char> local_451;
  string local_450 [32];
  string local_430 [39];
  undefined1 local_409 [33];
  string local_3e8 [39];
  allocator<char> local_3c1;
  string local_3c0 [32];
  string local_3a0 [39];
  allocator<char> local_379;
  string local_378 [32];
  string local_358 [39];
  undefined1 local_331 [33];
  string local_310 [39];
  allocator<char> local_2e9;
  string local_2e8 [32];
  string local_2c8 [39];
  allocator<char> local_2a1;
  string local_2a0 [56];
  string local_268 [39];
  allocator<char> local_241;
  string local_240 [56];
  string local_208 [39];
  allocator<char> local_1e1;
  string local_1e0 [32];
  string local_1c0 [39];
  allocator<char> local_199;
  string local_198 [32];
  string local_178 [39];
  allocator<char> local_151;
  string local_150 [56];
  string local_118 [39];
  allocator<char> local_f1;
  string local_f0 [32];
  string local_d0 [39];
  allocator<char> local_a9;
  string local_a8 [32];
  string local_88 [55];
  allocator<char> local_51;
  string local_50 [32];
  string local_30 [48];
  
  printf("usage: %s [options]\n",*in_RSI);
  printf("\n");
  printf("options:\n");
  printf("  -h, --help\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  join<std::__cxx11::string>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  uVar1 = std::__cxx11::string::c_str();
  printf("  -m, --model <filename>                    (default: %s)\n",uVar1);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  join<int>(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  uVar1 = std::__cxx11::string::c_str();
  printf("  -p, --n-prompt <n>                        (default: %s)\n",uVar1);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  join<int>(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  uVar1 = std::__cxx11::string::c_str();
  printf("  -n, --n-gen <n>                           (default: %s)\n",uVar1);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  transform_to_str<std::pair<int,int>,std::__cxx11::string(*)(std::pair<int,int>const&)>
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  join<std::__cxx11::string>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  uVar1 = std::__cxx11::string::c_str();
  printf("  -pg <pp,tg>                               (default: %s)\n",uVar1);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffff940);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  join<int>(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  uVar1 = std::__cxx11::string::c_str();
  printf("  -b, --batch-size <n>                      (default: %s)\n",uVar1);
  std::__cxx11::string::~string(local_178);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator(&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  join<int>(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  uVar1 = std::__cxx11::string::c_str();
  printf("  -ub, --ubatch-size <n>                    (default: %s)\n",uVar1);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  transform_to_str<ggml_type,char_const*(*)(ggml_type)>
            (in_stack_fffffffffffff988,(_func_char_ptr_ggml_type *)in_stack_fffffffffffff980);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  join<std::__cxx11::string>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  uVar1 = std::__cxx11::string::c_str();
  printf("  -ctk, --cache-type-k <t>                  (default: %s)\n",uVar1);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator(&local_241);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffff940);
  transform_to_str<ggml_type,char_const*(*)(ggml_type)>
            (in_stack_fffffffffffff988,(_func_char_ptr_ggml_type *)in_stack_fffffffffffff980);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  join<std::__cxx11::string>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  uVar1 = std::__cxx11::string::c_str();
  printf("  -ctv, --cache-type-v <t>                  (default: %s)\n",uVar1);
  std::__cxx11::string::~string(local_268);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffff940);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  join<int>(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  uVar1 = std::__cxx11::string::c_str();
  printf("  -t, --threads <n>                         (default: %s)\n",uVar1);
  std::__cxx11::string::~string(local_2c8);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  values = (vector<llama_split_mode,_std::allocator<llama_split_mode>_> *)local_331;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  join<std::__cxx11::string>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  uVar1 = std::__cxx11::string::c_str();
  printf("  -C, --cpu-mask <hex,hex>                  (default: %s)\n",uVar1);
  std::__cxx11::string::~string(local_310);
  std::__cxx11::string::~string((string *)(local_331 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_331);
  paVar4 = &local_379;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  join<bool>(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  uVar1 = std::__cxx11::string::c_str();
  printf("  --cpu-strict <0|1>                        (default: %s)\n",uVar1);
  std::__cxx11::string::~string(local_358);
  std::__cxx11::string::~string(local_378);
  std::allocator<char>::~allocator(&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  join<int>(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  uVar1 = std::__cxx11::string::c_str();
  printf("  --poll <0...100>                          (default: %s)\n",uVar1);
  std::__cxx11::string::~string(local_3a0);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_409;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  join<int>(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  uVar1 = std::__cxx11::string::c_str();
  printf("  -ngl, --n-gpu-layers <n>                  (default: %s)\n",uVar1);
  std::__cxx11::string::~string(local_3e8);
  std::__cxx11::string::~string((string *)(local_409 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_409);
  uVar2 = llama_supports_rpc();
  if ((uVar2 & 1) != 0) {
    in_stack_fffffffffffff968 = &local_451;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
    join<std::__cxx11::string>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
    uVar1 = std::__cxx11::string::c_str();
    printf("  -rpc, --rpc <rpc_servers>                 (default: %s)\n",uVar1);
    std::__cxx11::string::~string(local_430);
    std::__cxx11::string::~string(local_450);
    std::allocator<char>::~allocator(&local_451);
  }
  transform_to_str<llama_split_mode,char_const*(*)(llama_split_mode)>
            (values,(_func_char_ptr_llama_split_mode *)paVar4);
  paVar4 = &local_4b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_stack_fffffffffffff968,paVar4);
  join<std::__cxx11::string>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  uVar1 = std::__cxx11::string::c_str();
  printf("  -sm, --split-mode <none|layer|row>        (default: %s)\n",uVar1);
  std::__cxx11::string::~string(local_478);
  std::__cxx11::string::~string(local_4b0);
  std::allocator<char>::~allocator(&local_4b1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffff940);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_stack_fffffffffffff968,paVar4);
  join<int>(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  uVar1 = std::__cxx11::string::c_str();
  printf("  -mg, --main-gpu <i>                       (default: %s)\n",uVar1);
  std::__cxx11::string::~string(local_4d8);
  std::__cxx11::string::~string(local_4f8);
  std::allocator<char>::~allocator(&local_4f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_stack_fffffffffffff968,paVar4);
  join<bool>(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  uVar1 = std::__cxx11::string::c_str();
  printf("  -nkvo, --no-kv-offload <0|1>              (default: %s)\n",uVar1);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffae0);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator(&local_541);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_stack_fffffffffffff968,paVar4);
  join<bool>(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  uVar1 = std::__cxx11::string::c_str();
  printf("  -fa, --flash-attn <0|1>                   (default: %s)\n",uVar1);
  std::__cxx11::string::~string(local_568);
  std::__cxx11::string::~string(local_588);
  std::allocator<char>::~allocator(&local_589);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_stack_fffffffffffff968,paVar4);
  join<bool>(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  uVar1 = std::__cxx11::string::c_str();
  printf("  -mmp, --mmap <0|1>                        (default: %s)\n",uVar1);
  std::__cxx11::string::~string(local_5b0);
  std::__cxx11::string::~string(local_5d0);
  std::allocator<char>::~allocator(&local_5d1);
  printf("  --numa <distribute|isolate|numactl>       (default: disabled)\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_stack_fffffffffffff968,paVar4);
  join<bool>(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  uVar1 = std::__cxx11::string::c_str();
  printf("  -embd, --embeddings <0|1>                 (default: %s)\n",uVar1);
  std::__cxx11::string::~string(local_5f8);
  std::__cxx11::string::~string(local_618);
  std::allocator<char>::~allocator(&local_619);
  printf("  -ts, --tensor-split <ts0/ts1/..>          (default: 0)\n");
  printf("  -r, --repetitions <n>                     (default: %d)\n",
         (ulong)(uint)cmd_params_defaults.reps);
  printf("  --prio <0|1|2|3>                          (default: %d)\n",
         (ulong)cmd_params_defaults.prio);
  printf("  --delay <0...N> (seconds)                 (default: %d)\n",
         (ulong)(uint)cmd_params_defaults.delay);
  format = (output_formats)((ulong)in_stack_fffffffffffff928 >> 0x20);
  pcVar3 = output_format_str(format);
  printf("  -o, --output <csv|json|jsonl|md|sql>      (default: %s)\n",pcVar3);
  pcVar3 = output_format_str(format);
  printf("  -oe, --output-err <csv|json|jsonl|md|sql> (default: %s)\n",pcVar3);
  if ((cmd_params_defaults.verbose & 1U) == 0) {
    local_6d0 = "\\$0";
  }
  else {
    local_6d0 = "DC1";
  }
  local_6d0 = local_6d0 + 2;
  printf("  -v, --verbose                             (default: %s)\n",local_6d0);
  if ((cmd_params_defaults.progress & 1U) == 0) {
    pcVar3 = "\\$0";
  }
  else {
    pcVar3 = "DC1";
  }
  printf("  --progress                                (default: %s)\n",pcVar3 + 2);
  printf("\n");
  printf(
        "Multiple values can be given for each parameter by separating them with \',\' or by specifying the parameter multiple times.\n"
        );
  return;
}

Assistant:

static void print_usage(int /* argc */, char ** argv) {
    printf("usage: %s [options]\n", argv[0]);
    printf("\n");
    printf("options:\n");
    printf("  -h, --help\n");
    printf("  -m, --model <filename>                    (default: %s)\n", join(cmd_params_defaults.model, ",").c_str());
    printf("  -p, --n-prompt <n>                        (default: %s)\n",
           join(cmd_params_defaults.n_prompt, ",").c_str());
    printf("  -n, --n-gen <n>                           (default: %s)\n", join(cmd_params_defaults.n_gen, ",").c_str());
    printf("  -pg <pp,tg>                               (default: %s)\n",
           join(transform_to_str(cmd_params_defaults.n_pg, pair_str), ",").c_str());
    printf("  -b, --batch-size <n>                      (default: %s)\n",
           join(cmd_params_defaults.n_batch, ",").c_str());
    printf("  -ub, --ubatch-size <n>                    (default: %s)\n",
           join(cmd_params_defaults.n_ubatch, ",").c_str());
    printf("  -ctk, --cache-type-k <t>                  (default: %s)\n",
           join(transform_to_str(cmd_params_defaults.type_k, ggml_type_name), ",").c_str());
    printf("  -ctv, --cache-type-v <t>                  (default: %s)\n",
           join(transform_to_str(cmd_params_defaults.type_v, ggml_type_name), ",").c_str());
    printf("  -t, --threads <n>                         (default: %s)\n",
           join(cmd_params_defaults.n_threads, ",").c_str());
    printf("  -C, --cpu-mask <hex,hex>                  (default: %s)\n",
           join(cmd_params_defaults.cpu_mask, ",").c_str());
    printf("  --cpu-strict <0|1>                        (default: %s)\n",
           join(cmd_params_defaults.cpu_strict, ",").c_str());
    printf("  --poll <0...100>                          (default: %s)\n", join(cmd_params_defaults.poll, ",").c_str());
    printf("  -ngl, --n-gpu-layers <n>                  (default: %s)\n",
           join(cmd_params_defaults.n_gpu_layers, ",").c_str());
    if (llama_supports_rpc()) {
        printf("  -rpc, --rpc <rpc_servers>                 (default: %s)\n",
               join(cmd_params_defaults.rpc_servers, ",").c_str());
    }
    printf("  -sm, --split-mode <none|layer|row>        (default: %s)\n",
           join(transform_to_str(cmd_params_defaults.split_mode, split_mode_str), ",").c_str());
    printf("  -mg, --main-gpu <i>                       (default: %s)\n",
           join(cmd_params_defaults.main_gpu, ",").c_str());
    printf("  -nkvo, --no-kv-offload <0|1>              (default: %s)\n",
           join(cmd_params_defaults.no_kv_offload, ",").c_str());
    printf("  -fa, --flash-attn <0|1>                   (default: %s)\n",
           join(cmd_params_defaults.flash_attn, ",").c_str());
    printf("  -mmp, --mmap <0|1>                        (default: %s)\n",
           join(cmd_params_defaults.use_mmap, ",").c_str());
    printf("  --numa <distribute|isolate|numactl>       (default: disabled)\n");
    printf("  -embd, --embeddings <0|1>                 (default: %s)\n",
           join(cmd_params_defaults.embeddings, ",").c_str());
    printf("  -ts, --tensor-split <ts0/ts1/..>          (default: 0)\n");
    printf("  -r, --repetitions <n>                     (default: %d)\n", cmd_params_defaults.reps);
    printf("  --prio <0|1|2|3>                          (default: %d)\n", cmd_params_defaults.prio);
    printf("  --delay <0...N> (seconds)                 (default: %d)\n", cmd_params_defaults.delay);
    printf("  -o, --output <csv|json|jsonl|md|sql>      (default: %s)\n",
           output_format_str(cmd_params_defaults.output_format));
    printf("  -oe, --output-err <csv|json|jsonl|md|sql> (default: %s)\n",
           output_format_str(cmd_params_defaults.output_format_stderr));
    printf("  -v, --verbose                             (default: %s)\n", cmd_params_defaults.verbose ? "1" : "0");
    printf("  --progress                                (default: %s)\n", cmd_params_defaults.progress ? "1" : "0");
    printf("\n");
    printf(
        "Multiple values can be given for each parameter by separating them with ',' or by specifying the parameter "
        "multiple times.\n");
}